

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lm_trie.c
# Opt level: O0

bitarr_address_t longest_find(longest_t *longest,uint32 word,node_range_t *range)

{
  uint8 uVar1;
  bitarr_address_t bVar2;
  uint32 local_3c;
  node_range_t *pnStack_38;
  uint32 at_pointer;
  node_range_t *range_local;
  longest_t *plStack_28;
  uint32 word_local;
  longest_t *longest_local;
  bitarr_address_t address;
  
  pnStack_38 = range;
  range_local._4_4_ = word;
  plStack_28 = longest;
  uVar1 = uniform_find((longest->base).base,(longest->base).total_bits,(longest->base).word_bits,
                       (longest->base).word_mask,range->begin - 1,0,range->end,
                       (longest->base).max_vocab,word,&local_3c);
  if (uVar1 == '\0') {
    longest_local = (longest_t *)0x0;
    address.base._0_4_ = 0;
  }
  else {
    longest_local = (longest_t *)(plStack_28->base).base;
    address.base._0_4_ =
         local_3c * (plStack_28->base).total_bits + (uint)(plStack_28->base).word_bits;
  }
  bVar2.offset = (int)address.base;
  bVar2.base = longest_local;
  bVar2._12_4_ = 0;
  return bVar2;
}

Assistant:

static bitarr_address_t
longest_find(longest_t * longest, uint32 word, node_range_t * range)
{
    uint32 at_pointer;
    bitarr_address_t address;

    /* finding BitPacked with uniform find */
    if (!uniform_find
        ((void *) longest->base.base, longest->base.total_bits,
         longest->base.word_bits, longest->base.word_mask,
         range->begin - 1, 0, range->end, longest->base.max_vocab, word,
         &at_pointer)) {
        address.base = NULL;
        address.offset = 0;
        return address;
    }
    address.base = longest->base.base;
    address.offset =
        at_pointer * longest->base.total_bits + longest->base.word_bits;
    return address;
}